

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_palloc.c
# Opt level: O1

void ngx_pool_delete_file(void *data)

{
  ngx_log_t *log;
  int iVar1;
  int *piVar2;
  
  if (((*(ngx_log_t **)((long)data + 0x10))->log_level & 0x20) != 0) {
    ngx_log_error_core(8,*(ngx_log_t **)((long)data + 0x10),0,"file cleanup: fd:%d %s",(ulong)*data,
                       *(undefined8 *)((long)data + 8));
  }
  iVar1 = unlink(*(char **)((long)data + 8));
  if (iVar1 == -1) {
    piVar2 = __errno_location();
    if ((*piVar2 != 2) && (2 < (*(ngx_log_t **)((long)data + 0x10))->log_level)) {
      ngx_log_error_core(3,*(ngx_log_t **)((long)data + 0x10),*piVar2,"unlink() \"%s\" failed",
                         *(undefined8 *)((long)data + 8));
    }
  }
  iVar1 = close(*data);
  if ((iVar1 == -1) && (log = *(ngx_log_t **)((long)data + 0x10), 1 < log->log_level)) {
    piVar2 = __errno_location();
    ngx_log_error_core(2,log,*piVar2,"close() \"%s\" failed",*(undefined8 *)((long)data + 8));
    return;
  }
  return;
}

Assistant:

void
ngx_pool_delete_file(void *data)
{
    ngx_pool_cleanup_file_t  *c = data;

    ngx_err_t  err;

    ngx_log_debug2(NGX_LOG_DEBUG_ALLOC, c->log, 0, "file cleanup: fd:%d %s",
                   c->fd, c->name);

    if (ngx_delete_file(c->name) == NGX_FILE_ERROR) {
        err = ngx_errno;

        if (err != NGX_ENOENT) {
            ngx_log_error(NGX_LOG_CRIT, c->log, err,
                          ngx_delete_file_n " \"%s\" failed", c->name);
        }
    }

    if (ngx_close_file(c->fd) == NGX_FILE_ERROR) {
        ngx_log_error(NGX_LOG_ALERT, c->log, ngx_errno,
                      ngx_close_file_n " \"%s\" failed", c->name);
    }
}